

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scpserver.c
# Opt level: O1

void scp_source_throttle(ScpServer *s,_Bool throttled)

{
  if ((*(char *)((long)&s[-0x1a].vt + 7) == '\0') &&
     (*(_Bool *)((long)&s[-0x1a].vt + 6) = throttled, !throttled)) {
    scp_source_process_stack((ScpSource *)(s + -0x1b));
    return;
  }
  return;
}

Assistant:

static void scp_source_throttle(ScpServer *s, bool throttled)
{
    ScpSource *scp = container_of(s, ScpSource, scpserver);

    if (scp->finished)
        return;

    scp->throttled = throttled;
    if (!throttled)
        scp_source_process_stack(scp);
}